

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

bool __thiscall ON_Light::Write(ON_Light *this,ON_BinaryArchive *file)

{
  bool local_1d;
  bool rc;
  int i;
  ON_BinaryArchive *file_local;
  ON_Light *this_local;
  
  local_1d = ON_BinaryArchive::Write3dmChunkVersion(file,1,2);
  if (local_1d) {
    local_1d = ON_BinaryArchive::WriteInt(file,(uint)((this->m_bOn & 1U) != 0));
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteInt(file,this->m_style);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteDouble(file,this->m_intensity);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteDouble(file,this->m_watts);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteColor(file,&this->m_ambient);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteColor(file,&this->m_diffuse);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteColor(file,&this->m_specular);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteVector(file,&this->m_direction);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WritePoint(file,&this->m_location);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteDouble(file,this->m_spot_angle);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteDouble(file,this->m_spot_exponent);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteVector(file,&this->m_attenuation);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteDouble(file,this->m_shadow_intensity);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::Write3dmReferencedComponentIndex
                         (file,RenderLight,this->m_light_index);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteUuid(file,&this->m_light_id);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteString(file,&this->m_light_name);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteVector(file,&this->m_length);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteVector(file,&this->m_width);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::WriteDouble(file,this->m_hotspot);
  }
  return local_1d;
}

Assistant:

bool ON_Light::Write(
       ON_BinaryArchive& file
     ) const
{
  int i;
  bool rc = file.Write3dmChunkVersion(1,2);
  // version 1.0 fields
  if ( rc ) rc = file.WriteInt( m_bOn?1:0 );
  i = m_style;
  if ( rc ) rc = file.WriteInt( i );
  if ( rc ) rc = file.WriteDouble( m_intensity );
  if ( rc ) rc = file.WriteDouble( m_watts );
  if ( rc ) rc = file.WriteColor( m_ambient );
  if ( rc ) rc = file.WriteColor( m_diffuse );
  if ( rc ) rc = file.WriteColor( m_specular );
  if ( rc ) rc = file.WriteVector( m_direction );
  if ( rc ) rc = file.WritePoint( m_location );
  if ( rc ) rc = file.WriteDouble( m_spot_angle );
  if ( rc ) rc = file.WriteDouble( m_spot_exponent );
  if ( rc ) rc = file.WriteVector( m_attenuation );
  if ( rc ) rc = file.WriteDouble( m_shadow_intensity );
  if ( rc ) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderLight, m_light_index );
  if ( rc ) rc = file.WriteUuid( m_light_id );
  if ( rc ) rc = file.WriteString( m_light_name );
  // version 1.1 added support for linear and rectangular
  if ( rc ) rc = file.WriteVector( m_length );
  if ( rc ) rc = file.WriteVector( m_width );
  // version 1.2 added m_hotspot support
  if ( rc ) rc = file.WriteDouble( m_hotspot );
  return rc;
}